

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O2

void __thiscall Refal2::CRuleParser::direction(CRuleParser *this)

{
  string *str1;
  TTokenType TVar1;
  bool bVar2;
  allocator local_39;
  string local_38;
  
  TVar1 = (this->super_CQualifierParser).token.type;
  if (TVar1 == TT_Blank) {
    return;
  }
  this->state = (TState)afterDirection;
  *(undefined8 *)&this->field_0x1e80 = 0;
  if (TVar1 == TT_Word) {
    std::__cxx11::string::string((string *)&local_38,"r",&local_39);
    str1 = &(this->super_CQualifierParser).token.word;
    bVar2 = CompareNoCase(str1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar2) {
      CFunctionBuilder::SetRightDirection((CFunctionBuilder *)this);
      return;
    }
    std::__cxx11::string::string((string *)&local_38,"l",&local_39);
    bVar2 = CompareNoCase(str1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar2) {
      return;
    }
  }
  AddToken(this);
  return;
}

Assistant:

void CRuleParser::direction()
{
	if( token.type == TT_Blank ) {
		return;
	}
	state = &CRuleParser::afterDirection;
	if( token.type == TT_Word ) {
		if( CompareNoCase( token.word, RuleRightMatchingDirectionTag ) ) {
			CFunctionBuilder::SetRightDirection();
			return;
		} else if( CompareNoCase( token.word, RuleLeftMatchingDirectionTag ) ) {
			return;
		}
	}
	AddToken();
}